

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,uchar needle)

{
  qsizetype qVar1;
  longlong *plVar2;
  const_pointer pvVar3;
  byte in_CL;
  long in_RDX;
  long in_FS_OFFSET;
  void *n;
  char *b;
  long local_68;
  long local_60;
  long local_38;
  longlong local_30;
  long local_28;
  longlong local_20;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < 0) {
    qVar1 = QByteArrayView::size(&local_18);
    local_28 = in_RDX + qVar1;
    local_30 = 0;
    plVar2 = qMax<long_long>(&local_28,&local_30);
    local_20 = *plVar2;
  }
  else {
    qVar1 = QByteArrayView::size(&local_18);
    local_38 = qVar1 + -1;
    plVar2 = qMin<long_long>(&local_20,&local_38);
    local_20 = *plVar2;
  }
  pvVar3 = QByteArrayView::data(&local_18);
  if (pvVar3 == (const_pointer)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = qmemrchr(pvVar3,(uint)in_CL,local_20 + 1);
  }
  if (local_60 == 0) {
    local_68 = -1;
  }
  else {
    local_68 = local_60 - (long)pvVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, uchar needle) noexcept
{
    if (from < 0)
        from = qMax(from + haystack.size(), qsizetype(0));
    else
        from = qMin(from, haystack.size() - 1);

    const char *const b = haystack.data();
    const void *n = b ? qmemrchr(b, needle, from + 1) : nullptr;
    return n ? static_cast<const char *>(n) - b : -1;
}